

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::print_material_binding_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,MaterialBinding *mb,uint32_t indent)

{
  undefined8 uVar1;
  bool bVar2;
  value_type *pvVar3;
  value_type *pvVar4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship>_>_>
  *this_00;
  Relationship *pRVar5;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ordered_dict<tinyusdz::Relationship>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ordered_dict<tinyusdz::Relationship>_>_>_>
  *this_01;
  ulong uVar6;
  size_t sVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_02;
  const_reference pvVar8;
  ListEditQual local_4f4;
  string local_4f0;
  allocator local_4c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  undefined1 local_428 [8];
  string rel_name;
  Relationship *local_400;
  Relationship *rel;
  string coll_name;
  size_t i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  undefined1 local_388 [8];
  string purpose_name;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ordered_dict<tinyusdz::Relationship>_>
  *collection;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ordered_dict<tinyusdz::Relationship>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ordered_dict<tinyusdz::Relationship>_>_>_>
  *__range1_1;
  string local_340;
  allocator local_319;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  undefined1 local_2d8 [8];
  string matb_name;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship>
  *matb;
  const_iterator __end1;
  const_iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship>_>_>
  *__range1;
  string local_290;
  ListEditQual local_26c;
  string local_268;
  allocator local_241;
  string local_240;
  ListEditQual local_21c;
  string local_218;
  allocator local_1f1;
  string local_1f0;
  ListEditQual local_1cc;
  string local_1c8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream aoStack_198 [380];
  uint32_t local_1c;
  MaterialBinding *pMStack_18;
  uint32_t indent_local;
  MaterialBinding *mb_local;
  
  local_1c = (uint32_t)mb;
  pMStack_18 = (MaterialBinding *)this;
  mb_local = (MaterialBinding *)__return_storage_ptr__;
  if (this == (tinyusdz *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1a8);
    bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)pMStack_18);
    if (bVar2) {
      pvVar3 = nonstd::optional_lite::optional<tinyusdz::Relationship>::value
                         (&pMStack_18->materialBinding);
      pvVar4 = nonstd::optional_lite::optional<tinyusdz::Relationship>::value
                         (&pMStack_18->materialBinding);
      local_1cc = Relationship::get_listedit_qual(pvVar4);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1f0,"material:binding",&local_1f1);
      anon_unknown_173::print_relationship(&local_1c8,pvVar3,&local_1cc,false,&local_1f0,local_1c);
      std::operator<<(aoStack_198,(string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
    }
    bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool
                      ((optional *)&pMStack_18->materialBindingPreview);
    if (bVar2) {
      pvVar3 = nonstd::optional_lite::optional<tinyusdz::Relationship>::value
                         (&pMStack_18->materialBindingPreview);
      pvVar4 = nonstd::optional_lite::optional<tinyusdz::Relationship>::value
                         (&pMStack_18->materialBindingPreview);
      local_21c = Relationship::get_listedit_qual(pvVar4);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_240,"material:binding:preview",&local_241);
      anon_unknown_173::print_relationship(&local_218,pvVar3,&local_21c,false,&local_240,local_1c);
      std::operator<<(aoStack_198,(string *)&local_218);
      std::__cxx11::string::~string((string *)&local_218);
      std::__cxx11::string::~string((string *)&local_240);
      std::allocator<char>::~allocator((allocator<char> *)&local_241);
    }
    bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool
                      ((optional *)&pMStack_18->materialBindingFull);
    if (bVar2) {
      pvVar3 = nonstd::optional_lite::optional<tinyusdz::Relationship>::value
                         (&pMStack_18->materialBindingFull);
      pvVar4 = nonstd::optional_lite::optional<tinyusdz::Relationship>::value
                         (&pMStack_18->materialBindingFull);
      local_26c = Relationship::get_listedit_qual(pvVar4);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_290,"material:binding:full",(allocator *)((long)&__range1 + 7));
      anon_unknown_173::print_relationship(&local_268,pvVar3,&local_26c,false,&local_290,local_1c);
      std::operator<<(aoStack_198,(string *)&local_268);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)&local_290);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
    }
    this_00 = MaterialBinding::materialBindingMap_abi_cxx11_(pMStack_18);
    __end1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship>_>_>
             ::begin(this_00);
    matb = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship>
            *)std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship>_>_>
              ::end(this_00);
    while (bVar2 = std::operator!=(&__end1,(_Self *)&matb), bVar2) {
      matb_name.field_2._8_8_ =
           std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship>_>
           ::operator*(&__end1);
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_318,":",&local_319);
        std::operator+(&local_2f8,"material:binding",&local_318);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2d8,&local_2f8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       matb_name.field_2._8_8_);
        std::__cxx11::string::~string((string *)&local_2f8);
        std::__cxx11::string::~string((string *)&local_318);
        std::allocator<char>::~allocator((allocator<char> *)&local_319);
        pRVar5 = (Relationship *)(matb_name.field_2._8_8_ + 0x20);
        __range1_1._4_4_ =
             Relationship::get_listedit_qual((Relationship *)(matb_name.field_2._8_8_ + 0x20));
        anon_unknown_173::print_relationship
                  (&local_340,pRVar5,(ListEditQual *)((long)&__range1_1 + 4),false,
                   (string *)local_2d8,local_1c);
        std::operator<<(aoStack_198,(string *)&local_340);
        std::__cxx11::string::~string((string *)&local_340);
        std::__cxx11::string::~string((string *)local_2d8);
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship>_>
      ::operator++(&__end1);
    }
    this_01 = MaterialBinding::materialBindingCollectionMap_abi_cxx11_(pMStack_18);
    __end1_1 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ordered_dict<tinyusdz::Relationship>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ordered_dict<tinyusdz::Relationship>_>_>_>
               ::begin(this_01);
    collection = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ordered_dict<tinyusdz::Relationship>_>
                  *)std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ordered_dict<tinyusdz::Relationship>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ordered_dict<tinyusdz::Relationship>_>_>_>
                    ::end(this_01);
    while (bVar2 = std::operator!=(&__end1_1,(_Self *)&collection), bVar2) {
      purpose_name.field_2._8_8_ =
           std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ordered_dict<tinyusdz::Relationship>_>_>
           ::operator*(&__end1_1);
      std::__cxx11::string::string((string *)local_388);
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_3c8,":",(allocator *)((long)&i + 7));
        std::operator+(&local_3a8,&local_3c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       purpose_name.field_2._8_8_);
        std::__cxx11::string::operator=((string *)local_388,(string *)&local_3a8);
        std::__cxx11::string::~string((string *)&local_3a8);
        std::__cxx11::string::~string((string *)&local_3c8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&i + 7));
      }
      for (coll_name.field_2._8_8_ = 0; uVar1 = coll_name.field_2._8_8_,
          sVar7 = ordered_dict<tinyusdz::Relationship>::size
                            ((ordered_dict<tinyusdz::Relationship> *)
                             (purpose_name.field_2._8_8_ + 0x20)), (ulong)uVar1 < sVar7;
          coll_name.field_2._8_8_ = coll_name.field_2._8_8_ + 1) {
        this_02 = ordered_dict<tinyusdz::Relationship>::keys_abi_cxx11_
                            ((ordered_dict<tinyusdz::Relationship> *)
                             (purpose_name.field_2._8_8_ + 0x20));
        pvVar8 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](this_02,coll_name.field_2._8_8_);
        std::__cxx11::string::string((string *)&rel,(string *)pvVar8);
        local_400 = (Relationship *)0x0;
        bVar2 = ordered_dict<tinyusdz::Relationship>::at
                          ((ordered_dict<tinyusdz::Relationship> *)
                           (purpose_name.field_2._8_8_ + 0x20),coll_name.field_2._8_8_,&local_400);
        if (bVar2) {
          std::__cxx11::string::string((string *)local_428);
          uVar6 = std::__cxx11::string::empty();
          if ((uVar6 & 1) == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_4c8,":",&local_4c9);
            std::operator+(&local_4a8,"material:binding:collection",&local_4c8);
            std::operator+(&local_488,&local_4a8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rel
                          );
            std::operator+(&local_468,&local_488,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_388);
            std::__cxx11::string::operator=((string *)local_428,(string *)&local_468);
            std::__cxx11::string::~string((string *)&local_468);
            std::__cxx11::string::~string((string *)&local_488);
            std::__cxx11::string::~string((string *)&local_4a8);
            std::__cxx11::string::~string((string *)&local_4c8);
            std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
          }
          else {
            std::operator+(&local_448,"material:binding:collection",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_388);
            std::__cxx11::string::operator=((string *)local_428,(string *)&local_448);
            std::__cxx11::string::~string((string *)&local_448);
          }
          pRVar5 = local_400;
          local_4f4 = Relationship::get_listedit_qual(local_400);
          anon_unknown_173::print_relationship
                    (&local_4f0,pRVar5,&local_4f4,false,(string *)local_428,local_1c);
          std::operator<<(aoStack_198,(string *)&local_4f0);
          std::__cxx11::string::~string((string *)&local_4f0);
          std::__cxx11::string::~string((string *)local_428);
          rel_name.field_2._12_4_ = 0;
        }
        else {
          rel_name.field_2._12_4_ = 8;
        }
        std::__cxx11::string::~string((string *)&rel);
      }
      std::__cxx11::string::~string((string *)local_388);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ordered_dict<tinyusdz::Relationship>_>_>
      ::operator++(&__end1_1);
    }
    std::__cxx11::stringstream::str();
    rel_name.field_2._12_4_ = 1;
    std::__cxx11::stringstream::~stringstream(local_1a8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string print_material_binding(const MaterialBinding *mb, const uint32_t indent) {
  if (!mb) {
    return std::string();
  }

  std::stringstream ss;

  if (mb->materialBinding) {
    ss << print_relationship(mb->materialBinding.value(),
                             mb->materialBinding.value().get_listedit_qual(),
                             /* custom */ false, kMaterialBinding, indent);
  }

  if (mb->materialBindingPreview) {
    ss << print_relationship(
        mb->materialBindingPreview.value(),
        mb->materialBindingPreview.value().get_listedit_qual(),
        /* custom */ false, kMaterialBindingPreview, indent);
  }

  if (mb->materialBindingFull) {
    ss << print_relationship(
        mb->materialBindingFull.value(),
        mb->materialBindingFull.value().get_listedit_qual(),
        /* custom */ false, kMaterialBindingFull, indent);
  }

  // NOTE: matb does not include "material:binding", "material:binding:preview" and "material:binding:full"
  for (const auto &matb : mb->materialBindingMap()) {
    if (matb.first.empty()) {
      // this should not happen
      continue;
    }

    std::string matb_name = kMaterialBinding + std::string(":") + matb.first;

    ss << print_relationship(
        matb.second,
        matb.second.get_listedit_qual(),
        /* custom */ false, matb_name, indent);
    
  }

  // TODO: sort by collection name?
  for (const auto &collection : mb->materialBindingCollectionMap()) {

    std::string purpose_name;
    if (!collection.first.empty()) {
      purpose_name = std::string(":") + collection.first;
    }

    for (size_t i = 0; i < collection.second.size(); i++) {
      std::string coll_name = collection.second.keys()[i];
 
      const Relationship *rel{nullptr};
      if (!collection.second.at(i, &rel)) {
        // this should not happen though.
        continue;
      }

      std::string rel_name;

      if (coll_name.empty()) { 
        rel_name = kMaterialBindingCollection + purpose_name;
      } else {
        rel_name = kMaterialBindingCollection + std::string(":") + coll_name + purpose_name;
      }

      ss << print_relationship(
          *rel,
          rel->get_listedit_qual(),
          /* custom */ false, rel_name, indent);
    }
  }

  return ss.str();
}